

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_ATC_NAVAIDS_FundamentalParameterData.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData::Encode
          (IFF_ATC_NAVAIDS_FundamentalParameterData *this,KDataStream *stream)

{
  KDataStream::Write<float>(stream,(float)this->m_f32ERP);
  KDataStream::Write<float>(stream,(float)this->m_f32Freq);
  KDataStream::Write<float>(stream,(float)this->m_f32PgRF);
  KDataStream::Write<float>(stream,(float)this->m_f32PulseWidth);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32BurstLength);
  KDataStream::Write(stream,this->m_ui8AppMode);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding1);
  KDataStream::Write(stream,this->m_ui8Padding2);
  return;
}

Assistant:

void IFF_ATC_NAVAIDS_FundamentalParameterData::Encode( KDataStream & stream ) const
{
    stream << m_f32ERP
           << m_f32Freq
           << m_f32PgRF
           << m_f32PulseWidth
           << m_ui32BurstLength
           << m_ui8AppMode
           << m_ui16Padding1
           << m_ui8Padding2;
}